

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall SpeciesTracker::Remove(SpeciesTracker *this,string *promoter_name,Ptr *polymer)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  const_iterator local_48;
  __normal_iterator<std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
  local_40;
  shared_ptr<Polymer> *local_38;
  __normal_iterator<std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
  it;
  Ptr *polymer_local;
  string *promoter_name_local;
  SpeciesTracker *this_local;
  
  it._M_current = polymer;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
          ::count(&this->promoter_map_,promoter_name);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](&this->promoter_map_,promoter_name);
    local_30._M_current =
         (shared_ptr<Polymer> *)
         std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::begin
                   (pmVar3);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](&this->promoter_map_,promoter_name);
    local_38 = (shared_ptr<Polymer> *)
               std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::
               end(pmVar3);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<std::shared_ptr<Polymer>*,std::vector<std::shared_ptr<Polymer>,std::allocator<std::shared_ptr<Polymer>>>>,std::shared_ptr<Polymer>>
                         (local_30,(__normal_iterator<std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
                                    )local_38,polymer);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](&this->promoter_map_,promoter_name);
    local_40._M_current =
         (shared_ptr<Polymer> *)
         std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::end
                   (pmVar3);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
    if (bVar1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
               ::operator[](&this->promoter_map_,promoter_name);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Polymer>const*,std::vector<std::shared_ptr<Polymer>,std::allocator<std::shared_ptr<Polymer>>>>
      ::__normal_iterator<std::shared_ptr<Polymer>*>
                ((__normal_iterator<std::shared_ptr<Polymer>const*,std::vector<std::shared_ptr<Polymer>,std::allocator<std::shared_ptr<Polymer>>>>
                  *)&local_48,&local_28);
      std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::erase
                (pmVar3,local_48);
    }
  }
  return;
}

Assistant:

void SpeciesTracker::Remove(const std::string &promoter_name,
                            Polymer::Ptr polymer) {
  if (promoter_map_.count(promoter_name) != 0) {
    auto it = std::find(promoter_map_[promoter_name].begin(),
                        promoter_map_[promoter_name].end(), polymer);
    if (it != promoter_map_[promoter_name].end()) {
      promoter_map_[promoter_name].erase(it);
    }
  }
}